

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void TestPerfomanceRandom(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Test Perfomance Random",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  NoAction();
  Int2StrConvert();
  BoostLexicalCastOnStack();
  SpiritKarma();
  StdSprintf();
  StdStringStreamWithRewind();
  return;
}

Assistant:

void TestPerfomanceRandom()
{
    std::cout << "Test Perfomance Random" << std::endl;
    NoAction();
    Int2StrConvert();
#ifdef USE_BOOST
    BoostLexicalCastOnStack();
    SpiritKarma();
#endif
    StdSprintf();
    StdStringStreamWithRewind();
}